

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveUnusedBrs.cpp
# Opt level: O3

bool __thiscall
wasm::RemoveUnusedBrs::doWalkFunction(wasm::Function*)::FinalOptimizer::optimizeSetIfWithBrArm(wasm
::Expression___(void *this,Expression **currp)

{
  bool bVar1;
  LocalSet *pLVar2;
  undefined1 local_40 [8];
  anon_class_32_4_f7c106fa tryToOptimize;
  Expression **currp_local;
  LocalSet *set;
  If *iff;
  
  currp_local = (Expression **)*currp;
  tryToOptimize.currp = (Expression ***)currp;
  if (((Expression *)currp_local)->_id == LocalSetId) {
    set = (LocalSet *)(((Expression *)((long)currp_local + 0x10))->type).id;
    pLVar2 = (LocalSet *)0x0;
    if ((set->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression._id != IfId) {
      set = pLVar2;
    }
    if (set != (LocalSet *)0x0) {
      if (((set->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression.type.id < 2) ||
         (*(ulong *)(*(long *)&set->index + 8) < 2)) {
        pLVar2 = (LocalSet *)0x0;
      }
      else {
        tryToOptimize.this = (FinalOptimizer *)&set;
        tryToOptimize.iff = (If **)&currp_local;
        tryToOptimize.set = (LocalSet **)&tryToOptimize.currp;
        local_40 = (undefined1  [8])this;
        bVar1 = RemoveUnusedBrs::doWalkFunction::FinalOptimizer::optimizeSetIfWithBrArm::
                anon_class_32_4_f7c106fa::operator()
                          ((anon_class_32_4_f7c106fa *)local_40,set->value,
                           *(Expression **)
                            &set[1].super_SpecificExpression<(wasm::Expression::Id)9>.
                             super_Expression,false);
        pLVar2 = (LocalSet *)&DAT_00000001;
        if (!bVar1) {
          bVar1 = RemoveUnusedBrs::doWalkFunction::FinalOptimizer::optimizeSetIfWithBrArm::
                  anon_class_32_4_f7c106fa::operator()
                            ((anon_class_32_4_f7c106fa *)local_40,
                             *(Expression **)
                              &set[1].super_SpecificExpression<(wasm::Expression::Id)9>.
                               super_Expression,set->value,true);
          pLVar2 = (LocalSet *)(ulong)bVar1;
        }
      }
    }
    return SUB81(pLVar2,0);
  }
  __assert_fail("int(_id) == int(T::SpecificId)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm.h"
                ,0x314,"T *wasm::Expression::cast() [T = wasm::LocalSet]");
}

Assistant:

bool optimizeSetIfWithBrArm(Expression** currp) {
        auto* set = (*currp)->cast<LocalSet>();
        auto* iff = set->value->dynCast<If>();
        if (!iff || !iff->type.isConcrete() ||
            !iff->condition->type.isConcrete()) {
          return false;
        }
        auto tryToOptimize =
          [&](Expression* one, Expression* two, bool flipCondition) {
            if (one->type == Type::unreachable &&
                two->type != Type::unreachable) {
              if (auto* br = one->dynCast<Break>()) {
                if (ExpressionAnalyzer::isSimple(br)) {
                  // Wonderful, do it!
                  Builder builder(*getModule());
                  if (flipCondition) {
                    builder.flip(iff);
                  }
                  br->condition = iff->condition;
                  br->finalize();
                  set->value = two;
                  auto* block = builder.makeSequence(br, set);
                  *currp = block;
                  // Recurse on the set, which now has a new value.
                  optimizeSetIf(&block->list[1]);
                  return true;
                }
              }
            }
            return false;
          };
        return tryToOptimize(iff->ifTrue, iff->ifFalse, false) ||
               tryToOptimize(iff->ifFalse, iff->ifTrue, true);
      }